

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
pipe_organ_fn::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          pipe_organ_fn *this,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  
  pcVar7 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pcVar6 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar7 != pcVar6) {
    lVar3 = 0x3f;
    if ((long)pcVar6 - (long)pcVar7 != 0) {
      for (; (ulong)((long)pcVar6 - (long)pcVar7) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pcVar7,pcVar6,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pcVar7,pcVar6);
    pcVar7 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lVar3 = ((long)pcVar6 - (long)pcVar7) / 2;
  pcVar2 = pcVar6 + -1;
  if (pcVar7 + lVar3 < pcVar2 && pcVar7 + lVar3 != pcVar6) {
    pcVar5 = pcVar7 + lVar3;
    do {
      pcVar4 = pcVar5 + 1;
      cVar1 = *pcVar5;
      *pcVar5 = *pcVar2;
      *pcVar2 = cVar1;
      pcVar2 = pcVar2 + -1;
      pcVar5 = pcVar4;
    } while (pcVar4 < pcVar2);
    pcVar7 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = pcVar7;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = pcVar6;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end());
        std::reverse(c.begin() + std::distance(c.begin(), c.end()) / 2, c.end());
        return c;
    }